

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall
bssl::is_valid_client_hello_inner
          (bssl *this,SSL *ssl,uint8_t *out_alert,Span<const_unsigned_char> body)

{
  bool bVar1;
  int iVar2;
  uchar *in;
  size_t sVar3;
  uint8_t *puVar4;
  uint16_t local_d2;
  undefined1 local_d0 [6];
  uint16_t version;
  CBS versions;
  CBS extension;
  SSL_CLIENT_HELLO client_hello;
  uint8_t *out_alert_local;
  SSL *ssl_local;
  Span<const_unsigned_char> body_local;
  
  body_local.data_ = body.data_;
  ssl_local = (SSL *)out_alert;
  in = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&ssl_local);
  sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&ssl_local);
  iVar2 = SSL_parse_client_hello((SSL *)this,(SSL_CLIENT_HELLO *)&extension.len,in,sVar3);
  if ((((iVar2 == 0) ||
       (bVar1 = ssl_client_hello_get_extension
                          ((SSL_CLIENT_HELLO *)&extension.len,(CBS *)&versions.len,0xfe0d), !bVar1))
      || (sVar3 = CBS_len((CBS *)&versions.len), sVar3 != 1)) ||
     ((puVar4 = CBS_data((CBS *)&versions.len), *puVar4 != '\x01' ||
      (bVar1 = ssl_client_hello_get_extension
                         ((SSL_CLIENT_HELLO *)&extension.len,(CBS *)&versions.len,0x2b), !bVar1))))
  {
    *(undefined1 *)&ssl->method = 0x2f;
    ERR_put_error(0x10,0,0x13a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x68);
  }
  else {
    iVar2 = CBS_get_u8_length_prefixed((CBS *)&versions.len,(CBS *)local_d0);
    if (((iVar2 == 0) || (sVar3 = CBS_len((CBS *)&versions.len), sVar3 != 0)) ||
       (sVar3 = CBS_len((CBS *)local_d0), sVar3 == 0)) {
      *(undefined1 *)&ssl->method = 0x32;
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x72);
    }
    else {
      do {
        sVar3 = CBS_len((CBS *)local_d0);
        if (sVar3 == 0) {
          return true;
        }
        iVar2 = CBS_get_u16((CBS *)local_d0,&local_d2);
        if (iVar2 == 0) {
          *(undefined1 *)&ssl->method = 0x32;
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0x79);
          return false;
        }
      } while (((((local_d2 != 0x300) && (local_d2 != 0x301)) && (local_d2 != 0x302)) &&
               ((local_d2 != 0x303 && (local_d2 != 0xfeff)))) && (local_d2 != 0xfefd));
      *(undefined1 *)&ssl->method = 0x2f;
      ERR_put_error(0x10,0,0x13a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x80);
    }
  }
  return false;
}

Assistant:

static bool is_valid_client_hello_inner(SSL *ssl, uint8_t *out_alert,
                                        Span<const uint8_t> body) {
  // See draft-ietf-tls-esni-13, section 7.1.
  SSL_CLIENT_HELLO client_hello;
  CBS extension;
  if (!SSL_parse_client_hello(ssl, &client_hello, body.data(), body.size()) ||
      !ssl_client_hello_get_extension(&client_hello, &extension,
                                      TLSEXT_TYPE_encrypted_client_hello) ||
      CBS_len(&extension) != 1 ||  //
      CBS_data(&extension)[0] != ECH_CLIENT_INNER ||
      !ssl_client_hello_get_extension(&client_hello, &extension,
                                      TLSEXT_TYPE_supported_versions)) {
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_CLIENT_HELLO_INNER);
    return false;
  }
  // Parse supported_versions and reject TLS versions prior to TLS 1.3. Older
  // versions are incompatible with ECH.
  CBS versions;
  if (!CBS_get_u8_length_prefixed(&extension, &versions) ||
      CBS_len(&extension) != 0 ||  //
      CBS_len(&versions) == 0) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }
  while (CBS_len(&versions) != 0) {
    uint16_t version;
    if (!CBS_get_u16(&versions, &version)) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    if (version == SSL3_VERSION || version == TLS1_VERSION ||
        version == TLS1_1_VERSION || version == TLS1_2_VERSION ||
        version == DTLS1_VERSION || version == DTLS1_2_VERSION) {
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_CLIENT_HELLO_INNER);
      return false;
    }
  }
  return true;
}